

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::setPixel(OledI2C *this,OledPoint p)

{
  OledPoint p_00;
  OledPoint p_01;
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  reference pvVar4;
  int in_ESI;
  PixelOffset *in_RDI;
  PixelOffset po;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  byte local_24;
  
  p_00.m_y = in_stack_ffffffffffffffd4;
  p_00.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside((OledPixel *)in_RDI,p_00);
  if (bVar1) {
    p_01.m_y = in_ESI;
    p_01.m_x = in_stack_ffffffffffffffd0;
    anon_unknown.dwarf_59ba::PixelOffset::PixelOffset(in_RDI,p_01);
    std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
              ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pbVar3 = std::array<unsigned_char,_33UL>::operator[]
                       ((array<unsigned_char,_33UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (((uint)*pbVar3 & 1 << (local_24 & 0x1f)) == 0) {
      iVar2 = 1 << (local_24 & 0x1f);
      std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      pbVar3 = std::array<unsigned_char,_33UL>::operator[]
                         ((array<unsigned_char,_33UL> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *pbVar3 = *pbVar3 | (byte)iVar2;
      pvVar4 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                         ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                          CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      if ((pvVar4->dirty_ & 1U) == 0) {
        pvVar4 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                           ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                            CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        pvVar4->dirty_ = true;
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::setPixel(
    SSD1306::OledPoint p)
{
    if (not pixelInside(p))
    {
        return;
    }

    PixelOffset po{p};

    if ((blocks_[po.block].bytes_[po.byte] & (1 << po.bit)) == 0)
    {
        blocks_[po.block].bytes_[po.byte] |= (1 << po.bit);

        if (not blocks_[po.block].dirty_)
        {
            blocks_[po.block].dirty_ = true;
        }
    }
}